

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_options.c
# Opt level: O0

int archive_set_format_option(archive *_a,char *m,char *o,char *v)

{
  int iVar1;
  archive_write *a;
  char *v_local;
  char *o_local;
  char *m_local;
  archive *_a_local;
  
  if (_a[1].sconv == (archive_string_conv *)0x0) {
    _a_local._4_4_ = -0x15;
    if (m == (char *)0x0) {
      _a_local._4_4_ = -0x19;
    }
  }
  else if ((m == (char *)0x0) || (iVar1 = strcmp(m,(char *)_a[1].sconv), iVar1 == 0)) {
    if (_a[1].read_data_offset == 0) {
      _a_local._4_4_ = -0x14;
    }
    else {
      _a_local._4_4_ = (*(code *)_a[1].read_data_offset)(_a,o,v);
    }
  }
  else {
    _a_local._4_4_ = -0x15;
  }
  return _a_local._4_4_;
}

Assistant:

static int
archive_set_format_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_write *a = (struct archive_write *)_a;

	if (a->format_name == NULL)
		return (m == NULL)?ARCHIVE_FAILED:ARCHIVE_WARN - 1;
	/* If the format name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (m != NULL && strcmp(m, a->format_name) != 0)
		return (ARCHIVE_WARN - 1);
	if (a->format_options == NULL)
		return (ARCHIVE_WARN);
	return a->format_options(a, o, v);
}